

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.c
# Opt level: O2

ListNode * ListNext(LinkedList *list,ListNode *node)

{
  ListNode *pLVar1;
  
  if (list == (LinkedList *)0x0) {
    __assert_fail("list != NULL",".upnp/src/threadutil/LinkedList.c",0xf8,
                  "ListNode *ListNext(LinkedList *, ListNode *)");
  }
  if (node != (ListNode *)0x0) {
    pLVar1 = (ListNode *)0x0;
    if (node->next != &list->tail) {
      pLVar1 = node->next;
    }
    return pLVar1;
  }
  __assert_fail("node != NULL",".upnp/src/threadutil/LinkedList.c",0xf9,
                "ListNode *ListNext(LinkedList *, ListNode *)");
}

Assistant:

ListNode *ListNext(LinkedList *list, ListNode *node)
{
	assert(list != NULL);
	assert(node != NULL);

	if (!list || !node)
		return NULL;
	if (node->next == &list->tail)
		return NULL;
	else
		return node->next;
}